

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::write_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,Header *header)

{
  bool bVar1;
  streamoff sVar2;
  const_pointer pvVar3;
  undefined1 auVar4 [16];
  fpos<__mbstate_t> local_50;
  fpos<__mbstate_t> local_40;
  unsigned_long local_30;
  uint64_t header_size;
  undefined8 local_20;
  Header *local_18;
  Header *header_local;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *this_local;
  
  local_18 = header;
  header_local = (Header *)this;
  auVar4 = std::ostream::tellp();
  local_20 = auVar4._8_8_;
  header_size = auVar4._0_8_;
  sVar2 = std::fpos::operator_cast_to_long((fpos *)&header_size);
  if (sVar2 != 0) {
    __assert_fail("stream_.tellp() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                  ,0x100,
                  "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
                 );
  }
  pvVar3 = std::array<char,_8UL>::data(&magic_bytes);
  std::array<char,_8UL>::size(&magic_bytes);
  std::ostream::write(&this->field_0x38,(long)pvVar3);
  check_stream(this,"write magic bytes");
  write<unsigned_long>(this,&byte_order_mark);
  local_30 = 0x38;
  write<unsigned_long>(this,&local_30);
  write<hta::storage::file::Metric::Header>(this,local_18);
  std::fpos<__mbstate_t>::fpos(&local_40,local_30 + 0x18);
  (this->data_begin_)._M_off = local_40._M_off;
  (this->data_begin_)._M_state = local_40._M_state;
  local_50 = (fpos<__mbstate_t>)std::ostream::tellp();
  bVar1 = std::operator==(&local_50,&this->data_begin_);
  if (!bVar1) {
    __assert_fail("stream_.tellp() == data_begin_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                  ,0x108,
                  "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
                 );
  }
  flush(this);
  size(this);
  memcpy(&this->header_,local_18,0x38);
  return;
}

Assistant:

void write_preamble(const HeaderType& header)
    {
        assert(stream_.tellp() == 0);
        stream_.write(magic_bytes.data(), magic_bytes.size());
        check_stream("write magic bytes");
        write(byte_order_mark);
        uint64_t header_size = sizeof(header);
        write(header_size);
        write(header);
        data_begin_ = header_begin_ + header_size;
        assert(stream_.tellp() == data_begin_);
        flush();
        size();
        header_ = header;
    }